

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int kinLsDQJac(N_Vector u,N_Vector fu,SUNMatrix Jac,void *kinmem,N_Vector tmp1,N_Vector tmp2)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "KINSOL memory is NULL.";
    iVar2 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    iVar1 = 0x2d1;
  }
  else if (Jac == (SUNMatrix)0x0) {
    msgfmt = "Linear solver memory is NULL.";
    iVar2 = -2;
    error_code = -2;
    iVar1 = 0x2da;
  }
  else {
    iVar1 = SUNMatGetID(Jac);
    if (iVar1 == 0) {
      iVar1 = kinLsDenseDQJac(u,fu,Jac,(KINMem)kinmem,tmp1,tmp2);
      return iVar1;
    }
    iVar1 = SUNMatGetID(Jac);
    if (iVar1 == 3) {
      iVar1 = kinLsBandDQJac(u,fu,Jac,(KINMem)kinmem,tmp1,tmp2);
      return iVar1;
    }
    msgfmt = "unrecognized matrix type for kinLsDQJac";
    iVar2 = -2;
    error_code = -2;
    iVar1 = 0x2ea;
  }
  KINProcessError((KINMem)kinmem,error_code,iVar1,"kinLsDQJac",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int kinLsDQJac(N_Vector u, N_Vector fu, SUNMatrix Jac, void* kinmem,
               N_Vector tmp1, N_Vector tmp2)
{
  KINMem kin_mem;
  int retval;

  /* access KINMem structure */
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_KINMEM_NULL);
    return (KINLS_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_LMEM_NULL);
    return (KINLS_LMEM_NULL);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = kinLsDenseDQJac(u, fu, Jac, kin_mem, tmp1, tmp2);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = kinLsBandDQJac(u, fu, Jac, kin_mem, tmp1, tmp2);
  }
  else
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "unrecognized matrix type for kinLsDQJac");
    retval = KIN_ILL_INPUT;
  }
  return (retval);
}